

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_LookupTable(LookupTableForm2 LookupTable)

{
  uint8_t uVar1;
  bool bVar2;
  byte *pbVar3;
  reference pvVar4;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lookupTable;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined8 in_stack_fffffffffffffec8;
  size_type sVar5;
  uint8_t in_stack_fffffffffffffed6;
  uint8_t in_stack_fffffffffffffed7;
  value_type isAnyValue;
  allocator_type *in_stack_fffffffffffffed8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffee0;
  Image *image;
  size_type in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  value_type vVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  undefined1 local_99;
  Image local_98 [2];
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  pvVar6 = &local_20;
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  Unit_Test::randomImage(pvVar6);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffee0,(uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,in_stack_fffffffffffffed6
            );
  Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (uchar)(in_stack_fffffffffffffee8 >> 0x38));
  local_99 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1d9e3b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,(value_type_conflict *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1d9e69);
  uVar1 = Unit_Test::intensityValue();
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                      (ulong)*pbVar3);
  *pvVar4 = uVar1;
  uVar1 = Unit_Test::intensityValue();
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                      (ulong)*pbVar3);
  *pvVar4 = uVar1;
  (*local_8)(&local_48,&local_98[0]._data,local_98);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1d9f07);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,(allocator_type *)in_stack_fffffffffffffee0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1d9f2a);
  sVar5 = 0;
  pvVar6 = &local_20;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar6,0);
  image = local_98;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,(ulong)*pbVar3)
  ;
  isAnyValue = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_b8,sVar5);
  *pvVar4 = isAnyValue;
  sVar5 = 1;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar6,1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,(ulong)*pbVar3)
  ;
  vVar7 = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_b8,sVar5);
  *pvVar4 = vVar7;
  bVar2 = Unit_Test::verifyImage(image,pvVar6,(bool)isAnyValue);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d9fff);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1da00c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return bVar2;
}

Assistant:

bool form2_LookupTable(LookupTableForm2 LookupTable)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input  = randomImage( intensity );
        PenguinV_Image::Image output( input.width(), input.height() );

        output.fill( intensityValue() );

        std::vector < uint8_t > lookupTable( 256, 0 );

        lookupTable[intensity[0]] = intensityValue();
        lookupTable[intensity[1]] = intensityValue();

        LookupTable( input, output, lookupTable );

        std::vector < uint8_t > normalized( 2 );

        normalized[0] = lookupTable[intensity[0]];
        normalized[1] = lookupTable[intensity[1]];

        return verifyImage( output, normalized );
    }